

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ostream * duckdb_parquet::operator<<(ostream *out,type *val)

{
  type tVar1;
  char *__s;
  long lVar2;
  size_t sVar3;
  long lVar4;
  
  tVar1 = *val;
  if (_Encoding_VALUES_TO_NAMES._16_8_ != 0) {
    lVar2 = 0x19bcf90;
    lVar4 = _Encoding_VALUES_TO_NAMES._16_8_;
    do {
      if ((int)tVar1 <= *(int *)(lVar4 + 0x20)) {
        lVar2 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)(*(int *)(lVar4 + 0x20) < (int)tVar1) * 8);
    } while (lVar4 != 0);
    if ((lVar2 != 0x19bcf90) && (*(int *)(lVar2 + 0x20) <= (int)tVar1)) {
      __s = *(char **)(lVar2 + 0x28);
      if (__s != (char *)0x0) {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar3);
        return out;
      }
      std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
      return out;
    }
  }
  std::ostream::operator<<(out,tVar1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Encoding::type& val) {
  std::map<int, const char*>::const_iterator it = _Encoding_VALUES_TO_NAMES.find(val);
  if (it != _Encoding_VALUES_TO_NAMES.end()) {
    out << it->second;
  } else {
    out << static_cast<int>(val);
  }
  return out;
}